

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O3

easm_sinsn * dis_parse_sinsn(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  etype eVar2;
  int iVar3;
  litem **pplVar4;
  easm_sinsn *peVar5;
  easm_mods *peVar6;
  easm_operand *peVar7;
  easm_expr **ppeVar8;
  easm_expr *peVar9;
  easm_mod *peVar10;
  easm_mod **__ptr;
  easm_operand **__ptr_00;
  int iVar11;
  long lVar12;
  litem *plVar13;
  int iVar14;
  bool bVar15;
  
  peVar5 = (easm_sinsn *)calloc(0x40,1);
  pplVar4 = ctx->atoms;
  iVar14 = *spos;
  plVar13 = pplVar4[iVar14];
  peVar5->str = plVar13->str;
  iVar1 = plVar13->isunk;
  peVar5->isunk = iVar1;
  if (iVar1 != 0) {
    *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_INSN;
    iVar14 = *spos;
    plVar13 = pplVar4[iVar14];
  }
  iVar14 = iVar14 + 1;
  *spos = iVar14;
  if (plVar13->type != LITEM_NAME) {
    abort();
  }
  peVar6 = (easm_mods *)calloc(0x28,1);
  if (iVar14 < ctx->atomsnum) {
    __ptr_00 = (easm_operand **)0x0;
    iVar1 = 0;
    iVar11 = 0;
    do {
      pplVar4 = ctx->atoms;
      plVar13 = pplVar4[iVar14];
      eVar2 = plVar13->type;
      if (eVar2 == LITEM_NAME) {
        peVar10 = (easm_mod *)calloc(0x28,1);
        peVar10->str = plVar13->str;
        iVar14 = pplVar4[iVar14]->isunk;
        peVar10->isunk = iVar14;
        if (iVar14 != 0) {
          *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_OPERAND;
        }
        iVar14 = peVar6->modsnum;
        iVar3 = peVar6->modsmax;
        __ptr = peVar6->mods;
        if (iVar3 <= iVar14) {
          iVar14 = 0x10;
          if (iVar3 != 0) {
            iVar14 = iVar3 * 2;
          }
          peVar6->modsmax = iVar14;
          __ptr = (easm_mod **)realloc(__ptr,(long)iVar14 << 3);
          peVar6->mods = __ptr;
          iVar14 = peVar6->modsnum;
        }
        peVar6->modsnum = iVar14 + 1;
        __ptr[iVar14] = peVar10;
        iVar14 = *spos + 1;
        *spos = iVar14;
      }
      else {
        if (eVar2 == LITEM_SEEND) break;
        peVar7 = (easm_operand *)calloc(0x30,1);
        peVar7->mods = peVar6;
        peVar6 = (easm_mods *)calloc(0x28,1);
        peVar7->exprsmax = 0x10;
        ppeVar8 = (easm_expr **)malloc(0x80);
        peVar7->exprs = ppeVar8;
        peVar9 = dis_parse_expr(ctx,status,spos);
        iVar14 = peVar7->exprsnum;
        peVar7->exprsnum = iVar14 + 1;
        peVar7->exprs[iVar14] = peVar9;
        if (iVar1 <= iVar11) {
          bVar15 = iVar1 == 0;
          iVar1 = iVar1 * 2;
          if (bVar15) {
            iVar1 = 0x10;
          }
          peVar5->operandsmax = iVar1;
          __ptr_00 = (easm_operand **)realloc(__ptr_00,(long)iVar1 << 3);
          peVar5->operands = __ptr_00;
        }
        lVar12 = (long)iVar11;
        iVar11 = iVar11 + 1;
        peVar5->operandsnum = iVar11;
        __ptr_00[lVar12] = peVar7;
        iVar14 = *spos;
      }
    } while (iVar14 < ctx->atomsnum);
  }
  peVar5->mods = peVar6;
  return peVar5;
}

Assistant:

static struct easm_sinsn *dis_parse_sinsn(struct disctx *ctx, enum dis_status *status, int *spos) {
	struct easm_sinsn *res = calloc(sizeof *res, 1);
	res->str = ctx->atoms[*spos]->str;
	res->isunk = ctx->atoms[*spos]->isunk;
	if (res->isunk)
		*status |= DIS_STATUS_UNK_INSN;
	if (ctx->atoms[(*spos)++]->type != LITEM_NAME)
		abort();
	struct easm_mods *mods = calloc (sizeof *mods, 1);
	while (*spos < ctx->atomsnum && ctx->atoms[*spos]->type != LITEM_SEEND) {
		if (ctx->atoms[*spos]->type == LITEM_NAME) {
			struct easm_mod *mod = calloc(sizeof *mod, 1);
			mod->str = ctx->atoms[*spos]->str;
			mod->isunk = ctx->atoms[*spos]->isunk;
			if (mod->isunk)
				*status |= DIS_STATUS_UNK_OPERAND;
			ADDARRAY(mods->mods, mod);
			(*spos)++;
		} else {
			struct easm_operand *op = calloc (sizeof *op, 1);
			op->mods = mods;
			mods = calloc (sizeof *mods, 1);
			ADDARRAY(op->exprs, dis_parse_expr(ctx, status, spos));
			ADDARRAY(res->operands, op);
		}
	}
	res->mods = mods;
	return res;
}